

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

void __thiscall Catch::ReporterRegistry::ReporterRegistry(ReporterRegistry *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ReporterRegistryImpl *pRVar2;
  _Rb_tree_header *p_Var3;
  IReporterFactory *pIVar4;
  mapped_type *pmVar5;
  key_type local_40;
  
  pRVar2 = (ReporterRegistryImpl *)operator_new(0x48);
  p_Var3 = &(pRVar2->factories)._M_t._M_impl.super__Rb_tree_header;
  (pRVar2->listeners).
  super__Vector_base<Catch::Detail::unique_ptr<Catch::EventListenerFactory>,_std::allocator<Catch::Detail::unique_ptr<Catch::EventListenerFactory>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pRVar2->listeners).
  super__Vector_base<Catch::Detail::unique_ptr<Catch::EventListenerFactory>,_std::allocator<Catch::Detail::unique_ptr<Catch::EventListenerFactory>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pRVar2->listeners).
  super__Vector_base<Catch::Detail::unique_ptr<Catch::EventListenerFactory>,_std::allocator<Catch::Detail::unique_ptr<Catch::EventListenerFactory>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined8 *)&(pRVar2->factories)._M_t._M_impl = 0;
  *(undefined8 *)&(pRVar2->factories)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (pRVar2->factories)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (pRVar2->factories)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
  (pRVar2->factories)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header;
  (pRVar2->factories)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_impl).m_ptr = pRVar2;
  pIVar4 = (IReporterFactory *)operator_new(8);
  pIVar4->_vptr_IReporterFactory = (_func_int **)&PTR__IReporterFactory_003244b8;
  paVar1 = &local_40.field_2;
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Automake","");
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Detail::unique_ptr<Catch::IReporterFactory>,_Catch::Detail::CaseInsensitiveLess,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Detail::unique_ptr<Catch::IReporterFactory>_>_>_>
           ::operator[](&pRVar2->factories,&local_40);
  if (pmVar5->m_ptr != (IReporterFactory *)0x0) {
    (*pmVar5->m_ptr->_vptr_IReporterFactory[1])();
  }
  pmVar5->m_ptr = pIVar4;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  pIVar4 = (IReporterFactory *)operator_new(8);
  pIVar4->_vptr_IReporterFactory = (_func_int **)&PTR__IReporterFactory_00324500;
  pRVar2 = (this->m_impl).m_ptr;
  if (pRVar2 != (ReporterRegistryImpl *)0x0) {
    local_40._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"compact","");
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Detail::unique_ptr<Catch::IReporterFactory>,_Catch::Detail::CaseInsensitiveLess,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Detail::unique_ptr<Catch::IReporterFactory>_>_>_>
             ::operator[](&pRVar2->factories,&local_40);
    if (pmVar5->m_ptr != (IReporterFactory *)0x0) {
      (*pmVar5->m_ptr->_vptr_IReporterFactory[1])();
    }
    pmVar5->m_ptr = pIVar4;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != paVar1) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    pIVar4 = (IReporterFactory *)operator_new(8);
    pIVar4->_vptr_IReporterFactory = (_func_int **)&PTR__IReporterFactory_00324548;
    pRVar2 = (this->m_impl).m_ptr;
    if (pRVar2 != (ReporterRegistryImpl *)0x0) {
      local_40._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"console","");
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Detail::unique_ptr<Catch::IReporterFactory>,_Catch::Detail::CaseInsensitiveLess,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Detail::unique_ptr<Catch::IReporterFactory>_>_>_>
               ::operator[](&pRVar2->factories,&local_40);
      if (pmVar5->m_ptr != (IReporterFactory *)0x0) {
        (*pmVar5->m_ptr->_vptr_IReporterFactory[1])();
      }
      pmVar5->m_ptr = pIVar4;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != paVar1) {
        operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      }
      pIVar4 = (IReporterFactory *)operator_new(8);
      pIVar4->_vptr_IReporterFactory = (_func_int **)&PTR__IReporterFactory_00324590;
      pRVar2 = (this->m_impl).m_ptr;
      if (pRVar2 != (ReporterRegistryImpl *)0x0) {
        local_40._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"JUnit","");
        pmVar5 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Detail::unique_ptr<Catch::IReporterFactory>,_Catch::Detail::CaseInsensitiveLess,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Detail::unique_ptr<Catch::IReporterFactory>_>_>_>
                 ::operator[](&pRVar2->factories,&local_40);
        if (pmVar5->m_ptr != (IReporterFactory *)0x0) {
          (*pmVar5->m_ptr->_vptr_IReporterFactory[1])();
        }
        pmVar5->m_ptr = pIVar4;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_40._M_dataplus._M_p != paVar1) {
          operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
        }
        pIVar4 = (IReporterFactory *)operator_new(8);
        pIVar4->_vptr_IReporterFactory = (_func_int **)&PTR__IReporterFactory_003245d8;
        pRVar2 = (this->m_impl).m_ptr;
        if (pRVar2 != (ReporterRegistryImpl *)0x0) {
          local_40._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"SonarQube","");
          pmVar5 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Detail::unique_ptr<Catch::IReporterFactory>,_Catch::Detail::CaseInsensitiveLess,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Detail::unique_ptr<Catch::IReporterFactory>_>_>_>
                   ::operator[](&pRVar2->factories,&local_40);
          if (pmVar5->m_ptr != (IReporterFactory *)0x0) {
            (*pmVar5->m_ptr->_vptr_IReporterFactory[1])();
          }
          pmVar5->m_ptr = pIVar4;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_40._M_dataplus._M_p != paVar1) {
            operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
          }
          pIVar4 = (IReporterFactory *)operator_new(8);
          pIVar4->_vptr_IReporterFactory = (_func_int **)&PTR__IReporterFactory_00324620;
          pRVar2 = (this->m_impl).m_ptr;
          if (pRVar2 != (ReporterRegistryImpl *)0x0) {
            local_40._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"TAP","");
            pmVar5 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Detail::unique_ptr<Catch::IReporterFactory>,_Catch::Detail::CaseInsensitiveLess,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Detail::unique_ptr<Catch::IReporterFactory>_>_>_>
                     ::operator[](&pRVar2->factories,&local_40);
            if (pmVar5->m_ptr != (IReporterFactory *)0x0) {
              (*pmVar5->m_ptr->_vptr_IReporterFactory[1])();
            }
            pmVar5->m_ptr = pIVar4;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_40._M_dataplus._M_p != paVar1) {
              operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
            }
            pIVar4 = (IReporterFactory *)operator_new(8);
            pIVar4->_vptr_IReporterFactory = (_func_int **)&PTR__IReporterFactory_00324668;
            pRVar2 = (this->m_impl).m_ptr;
            if (pRVar2 != (ReporterRegistryImpl *)0x0) {
              local_40._M_dataplus._M_p = (pointer)paVar1;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"TeamCity","");
              pmVar5 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Detail::unique_ptr<Catch::IReporterFactory>,_Catch::Detail::CaseInsensitiveLess,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Detail::unique_ptr<Catch::IReporterFactory>_>_>_>
                       ::operator[](&pRVar2->factories,&local_40);
              if (pmVar5->m_ptr != (IReporterFactory *)0x0) {
                (*pmVar5->m_ptr->_vptr_IReporterFactory[1])();
              }
              pmVar5->m_ptr = pIVar4;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_40._M_dataplus._M_p != paVar1) {
                operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1
                               );
              }
              pIVar4 = (IReporterFactory *)operator_new(8);
              pIVar4->_vptr_IReporterFactory = (_func_int **)&PTR__IReporterFactory_003246b0;
              pRVar2 = (this->m_impl).m_ptr;
              if (pRVar2 != (ReporterRegistryImpl *)0x0) {
                local_40._M_dataplus._M_p = (pointer)paVar1;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"XML","");
                pmVar5 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Detail::unique_ptr<Catch::IReporterFactory>,_Catch::Detail::CaseInsensitiveLess,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Detail::unique_ptr<Catch::IReporterFactory>_>_>_>
                         ::operator[](&pRVar2->factories,&local_40);
                if (pmVar5->m_ptr != (IReporterFactory *)0x0) {
                  (*pmVar5->m_ptr->_vptr_IReporterFactory[1])();
                }
                pmVar5->m_ptr = pIVar4;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_40._M_dataplus._M_p != paVar1) {
                  operator_delete(local_40._M_dataplus._M_p,
                                  local_40.field_2._M_allocated_capacity + 1);
                }
                return;
              }
            }
          }
        }
      }
    }
  }
  __assert_fail("m_ptr",
                "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.hpp"
                ,0x385,
                "T *Catch::Detail::unique_ptr<Catch::ReporterRegistry::ReporterRegistryImpl>::operator->() [T = Catch::ReporterRegistry::ReporterRegistryImpl]"
               );
}

Assistant:

ReporterRegistry::ReporterRegistry():
        m_impl( Detail::make_unique<ReporterRegistryImpl>() ) {
        // Because it is impossible to move out of initializer list,
        // we have to add the elements manually
        m_impl->factories["Automake"] =
            Detail::make_unique<ReporterFactory<AutomakeReporter>>();
        m_impl->factories["compact"] =
            Detail::make_unique<ReporterFactory<CompactReporter>>();
        m_impl->factories["console"] =
            Detail::make_unique<ReporterFactory<ConsoleReporter>>();
        m_impl->factories["JUnit"] =
            Detail::make_unique<ReporterFactory<JunitReporter>>();
        m_impl->factories["SonarQube"] =
            Detail::make_unique<ReporterFactory<SonarQubeReporter>>();
        m_impl->factories["TAP"] =
            Detail::make_unique<ReporterFactory<TAPReporter>>();
        m_impl->factories["TeamCity"] =
            Detail::make_unique<ReporterFactory<TeamCityReporter>>();
        m_impl->factories["XML"] =
            Detail::make_unique<ReporterFactory<XmlReporter>>();
    }